

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O3

void __thiscall Enterprise::Nick::output_pixel<8,false>(Nick *this,uint16_t *target,int columns)

{
  uint8_t source;
  uint8_t source_00;
  uint8_t *puVar1;
  uint16_t uVar2;
  long lVar3;
  
  if (0 < columns) {
    puVar1 = this->ram_;
    lVar3 = 0;
    do {
      source = puVar1[(uint)this->line_data_pointer_[0] + (int)lVar3 & 0xffff];
      source_00 = puVar1[(uint)this->line_data_pointer_[0] + (int)lVar3 + 1 & 0xffff];
      this->last_read_ = source_00;
      uVar2 = anon_unknown.dwarf_c68e8f::mapped_colour(source);
      target[lVar3] = uVar2;
      uVar2 = anon_unknown.dwarf_c68e8f::mapped_colour(source_00);
      target[lVar3 + 1] = uVar2;
      lVar3 = lVar3 + 2;
      columns = columns + -1;
    } while (columns != 0);
  }
  return;
}

Assistant:

void Nick::output_pixel(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	int index = 0;
	for(int c = 0; c < columns; c++) {
		uint8_t pixels[2] = {
			ram_[(line_data_pointer_[0] + index) & 0xffff],
			ram_[(line_data_pointer_[0] + index + 1) & 0xffff]
		};
		index += is_lpixel ? 1 : 2;
		last_read_ = pixels[1];

		switch(bpp) {
			default:
			case 1: {
				const uint16_t *palette = alt_ind_palettes[((pixels[0] >> 6) & 0x02) | (pixels[0]&1)];
				pixels[0] &= two_colour_mask_;
				output1bpp(pixels[0]);

				if constexpr (!is_lpixel) {
					palette = alt_ind_palettes[((pixels[1] >> 6) & 0x02) | (pixels[1]&1)];
					pixels[1] &= two_colour_mask_;
					output1bpp(pixels[1]);
				}
			} break;

			case 2:
				output2bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output2bpp(pixels[1]);
				}
			break;

			case 4:
				output4bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output4bpp(pixels[1]);
				}
			break;

			case 8:
				output8bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output8bpp(pixels[1]);
				}
			break;
		}
	}
}